

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy_s.c
# Opt level: O3

errno_t memcpy_s(void *dest,rsize_t dmax,void *src,rsize_t smax)

{
  long lVar1;
  errno_t error;
  errno_t eVar2;
  uint32_t len;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (void *)0x0) {
    pcVar3 = "wmemcpy_s: dest is NULL";
LAB_0010282a:
    pcVar3 = pcVar3 + 1;
    eVar2 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    pcVar3 = "wmemcpy_s: dmax is 0";
LAB_00102875:
    pcVar3 = pcVar3 + 1;
    eVar2 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      len = (uint32_t)dmax;
      if (smax == 0) {
        mem_prim_set(dest,len,'\0');
        pcVar3 = "wmemcpy_s: smax is 0";
        goto LAB_00102875;
      }
      if (smax <= dmax) {
        if (src == (void *)0x0) {
          mem_prim_set(dest,len,'\0');
          pcVar3 = "wmemcpy_s: src is NULL";
          goto LAB_0010282a;
        }
        if ((dest <= src || (void *)((long)src + smax) <= dest) &&
           ((void *)((long)dest + dmax) <= src || src <= dest)) {
          mem_prim_move(dest,src,(uint32_t)smax);
          eVar2 = 0;
          goto LAB_00102886;
        }
        mem_prim_set(dest,len,'\0');
        pcVar3 = "memcpy_s: overlap undefined";
        eVar2 = 0x194;
        error = 0x194;
        goto LAB_00102881;
      }
      mem_prim_set(dest,len,'\0');
      pcVar3 = "wmemcpy_s: smax exceeds dmax";
    }
    else {
      pcVar3 = "wmemcpy_s: dmax exceeds max";
    }
    pcVar3 = pcVar3 + 1;
    eVar2 = 0x193;
    error = 0x193;
  }
LAB_00102881:
  invoke_safe_mem_constraint_handler(pcVar3,(void *)0x0,error);
LAB_00102886:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar2;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcpy_s (void *dest, rsize_t dmax, const void *src, rsize_t smax)
{
    uint8_t *dp;
    const uint8_t  *sp;

    dp = dest;
    sp = src;

    if (dp == NULL) {
        invoke_safe_mem_constraint_handler("memcpy_s: dest is NULL",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcpy_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memcpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    // AR: This is not a requirement according to the ISO spec - Change?
    // AR: documentation needed on use of the error handlers -
    // AR: default err handler should output to stderr on DEBUG
    // AR: update docs to define return RCNEGATE of the error number
    if (smax == 0) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: smax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (smax > dmax) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: smax exceeds dmax",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    if (sp == NULL) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: src is NULL",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }


    /*
     * overlap is undefined behavior, do not allow
     */
    if( ((dp > sp) && (dp < (sp+smax))) ||
        ((sp > dp) && (sp < (dp+dmax))) ) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: overlap undefined",
                   NULL, ESOVRLP);
        return RCNEGATE(ESOVRLP);
    }

    /*
     * now perform the copy
     */
    mem_prim_move(dp, sp, smax);

    return RCNEGATE(EOK);
}